

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void i_number_suite::i_number_pos_double_huge_exp(void)

{
  size_t sVar1;
  char *this;
  unkbyte10 in_ST0;
  char input [10];
  reader reader;
  view_type local_188;
  longdouble local_178;
  char local_168 [16];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_168,"1.5e+9999",10);
  sVar1 = strlen(local_168);
  local_188._M_len._0_4_ = (value)sVar1;
  local_188._M_len._4_4_ = (undefined4)(sVar1 >> 0x20);
  local_188._M_str._0_2_ = SUB82(local_168,0);
  local_188._M_str._2_6_ = (undefined6)((ulong)local_168 >> 0x10);
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_188);
  local_188._M_len._0_4_ = local_158.decoder.current.code;
  local_178 = (longdouble)CONCAT64(local_178._4_6_,9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x41,"void i_number_suite::i_number_pos_double_huge_exp()",&local_188,&local_178);
  local_188._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_188._M_str._0_2_ = SUB82(local_158.decoder.current.view.head,0);
  local_188._M_str._2_6_ = (undefined6)((ulong)local_158.decoder.current.view.head >> 0x10);
  this = "\"1.5e+9999\"";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[10]>
            ("reader.literal()","\"1.5e+9999\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x42,"void i_number_suite::i_number_pos_double_huge_exp()",&local_188,"1.5e+9999");
  trial::protocol::json::basic_reader<char>::value<long_double>
            ((longdouble *)&local_158,(basic_reader<char> *)this);
  local_188._M_len._0_4_ = (value)in_ST0;
  local_188._M_len._4_4_ = (undefined4)((unkuint10)in_ST0 >> 0x20);
  local_188._M_str._0_2_ = (undefined2)((unkuint10)in_ST0 >> 0x40);
  local_178 = (longdouble)INFINITY;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("reader.value<long double>()","std::numeric_limits<long double>::infinity()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x44,"void i_number_suite::i_number_pos_double_huge_exp()",&local_188,&local_178);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_number_pos_double_huge_exp()
{
    const char input[] = "1.5e+9999";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1.5e+9999");
    // Cannot be represented by long double
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<long double>(), std::numeric_limits<long double>::infinity());
}